

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O0

void __thiscall CServerBrowser::RemoveRequest(CServerBrowser *this,CServerEntry *pEntry)

{
  CServerEntry *pEntry_local;
  CServerBrowser *this_local;
  
  if (((pEntry->m_pPrevReq != (CServerEntry *)0x0) || (pEntry->m_pNextReq != (CServerEntry *)0x0))
     || (this->m_pFirstReqServer == pEntry)) {
    if (pEntry->m_pPrevReq == (CServerEntry *)0x0) {
      this->m_pFirstReqServer = pEntry->m_pNextReq;
    }
    else {
      pEntry->m_pPrevReq->m_pNextReq = pEntry->m_pNextReq;
    }
    if (pEntry->m_pNextReq == (CServerEntry *)0x0) {
      this->m_pLastReqServer = pEntry->m_pPrevReq;
    }
    else {
      pEntry->m_pNextReq->m_pPrevReq = pEntry->m_pPrevReq;
    }
    pEntry->m_pPrevReq = (CServerEntry *)0x0;
    pEntry->m_pNextReq = (CServerEntry *)0x0;
    this->m_NumRequests = this->m_NumRequests + -1;
  }
  return;
}

Assistant:

void CServerBrowser::RemoveRequest(CServerEntry *pEntry)
{
	if(pEntry->m_pPrevReq || pEntry->m_pNextReq || m_pFirstReqServer == pEntry)
	{
		if(pEntry->m_pPrevReq)
			pEntry->m_pPrevReq->m_pNextReq = pEntry->m_pNextReq;
		else
			m_pFirstReqServer = pEntry->m_pNextReq;

		if(pEntry->m_pNextReq)
			pEntry->m_pNextReq->m_pPrevReq = pEntry->m_pPrevReq;
		else
			m_pLastReqServer = pEntry->m_pPrevReq;

		pEntry->m_pPrevReq = 0;
		pEntry->m_pNextReq = 0;
		m_NumRequests--;
	}
}